

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseLibraryImports(Parser *this)

{
  pointer pbVar1;
  bool bVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *importName;
  pointer __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range3;
  String name;
  pointer local_38;
  
  while( true ) {
    bVar2 = Accept(this,Import);
    if (!bVar2) {
      return;
    }
    ParseName_abi_cxx11_(&name,this);
    if (name._M_string_length == 0) break;
    pbVar1 = (this->m_importList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = 0;
    for (__lhs = (this->m_importList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
      bVar2 = std::operator==(__lhs,&name);
      bVar3 = bVar3 | bVar2;
    }
    if (bVar3 == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
      ::push_back(&this->m_importList,&name);
      bVar2 = Runtime::LibraryExists
                        ((this->m_runtime).
                         super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &name);
      if (!bVar2) {
        local_38 = name._M_dataplus._M_p;
        Error<char_const*>(this,"Could not find library named \'%s\'",&local_38);
        goto LAB_00129911;
      }
    }
    Expect(this,NewLine,(char *)0x0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&name);
  }
  Error<>(this,"Expected valid name after \'import\' keyword");
LAB_00129911:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&name);
  return;
}

Assistant:

inline_t void Parser::ParseLibraryImports()
	{
		while (true)
		{
			if (!Accept(SymbolType::Import))
				break;
			auto name = ParseName();
			if (name.empty())
			{
				Error("Expected valid name after 'import' keyword");
				return;
			}

			// Check to make sure we're not adding duplicates
			bool foundDup = false;
			for (auto & importName : m_importList)
			{
				if (importName == name)
				{
					foundDup = true;
					continue;
				}
			}

			// Add library to the list of imported libraries for this script
			if (!foundDup)
			{
				m_importList.push_back(name);
				if (!m_runtime->LibraryExists(name))
				{
					Error("Could not find library named '%s'", name.c_str());
					break;
				}
			}

			Expect(SymbolType::NewLine);
		}
	}